

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintExpressionContents::visitUnary(PrintExpressionContents *this,Unary *curr)

{
  long lVar1;
  ostream **ppoVar2;
  char *pcVar3;
  ostream *poVar4;
  
  poVar4 = this->o;
  ppoVar2 = &this->o;
  Colors::outputColorCode(poVar4,"\x1b[35m");
  Colors::outputColorCode(poVar4,"\x1b[1m");
  switch(curr->op) {
  case ClzInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.clz";
    goto LAB_00a41598;
  case ClzInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.clz";
    goto LAB_00a41598;
  case CtzInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.ctz";
    goto LAB_00a41598;
  case CtzInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.ctz";
    goto LAB_00a41598;
  case PopcntInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.popcnt";
    goto LAB_00a413dc;
  case PopcntInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.popcnt";
    goto LAB_00a413dc;
  case NegFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.neg";
    goto LAB_00a41598;
  case NegFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.neg";
    goto LAB_00a41598;
  case AbsFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.abs";
    goto LAB_00a41598;
  case AbsFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.abs";
    goto LAB_00a41598;
  case CeilFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.ceil";
    goto LAB_00a4108e;
  case CeilFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.ceil";
    goto LAB_00a4108e;
  case FloorFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.floor";
    break;
  case FloorFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.floor";
    break;
  case TruncFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.trunc";
    break;
  case TruncFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.trunc";
    break;
  case NearestFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.nearest";
    goto LAB_00a41559;
  case NearestFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.nearest";
    goto LAB_00a41559;
  case SqrtFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.sqrt";
    goto LAB_00a4108e;
  case SqrtFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.sqrt";
    goto LAB_00a4108e;
  case EqZInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.eqz";
    goto LAB_00a41598;
  case EqZInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.eqz";
LAB_00a41598:
    lVar1 = 7;
    goto LAB_00a4159d;
  case ExtendSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend_i32_s";
    goto LAB_00a41026;
  case ExtendUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend_i32_u";
LAB_00a41026:
    lVar1 = 0x10;
    goto LAB_00a4159d;
  case WrapInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.wrap_i64";
    goto LAB_00a410ec;
  case TruncSFloat32ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_f32_s";
    goto LAB_00a4157b;
  case TruncSFloat32ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_f32_s";
    goto LAB_00a4157b;
  case TruncUFloat32ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_f32_u";
    goto LAB_00a4157b;
  case TruncUFloat32ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_f32_u";
    goto LAB_00a4157b;
  case TruncSFloat64ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_f64_s";
    goto LAB_00a4157b;
  case TruncSFloat64ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_f64_s";
    goto LAB_00a4157b;
  case TruncUFloat64ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_f64_u";
    goto LAB_00a4157b;
  case TruncUFloat64ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_f64_u";
    goto LAB_00a4157b;
  case ReinterpretFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.reinterpret_f32";
    goto LAB_00a4156a;
  case ReinterpretFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.reinterpret_f64";
    goto LAB_00a4156a;
  case ConvertSInt32ToFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.convert_i32_s";
    goto LAB_00a414d3;
  case ConvertSInt32ToFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.convert_i32_s";
    goto LAB_00a414d3;
  case ConvertUInt32ToFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.convert_i32_u";
    goto LAB_00a414d3;
  case ConvertUInt32ToFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.convert_i32_u";
    goto LAB_00a414d3;
  case ConvertSInt64ToFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.convert_i64_s";
    goto LAB_00a414d3;
  case ConvertSInt64ToFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.convert_i64_s";
    goto LAB_00a414d3;
  case ConvertUInt64ToFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.convert_i64_u";
    goto LAB_00a414d3;
  case ConvertUInt64ToFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.convert_i64_u";
LAB_00a414d3:
    lVar1 = 0x11;
    goto LAB_00a4159d;
  case PromoteFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.promote_f32";
LAB_00a4157b:
    lVar1 = 0xf;
    goto LAB_00a4159d;
  case DemoteFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.demote_f64";
    goto LAB_00a41537;
  case ReinterpretInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.reinterpret_i32";
    goto LAB_00a4156a;
  case ReinterpretInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.reinterpret_i64";
    goto LAB_00a4156a;
  case ExtendS8Int32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.extend8_s";
    goto LAB_00a41548;
  case ExtendS16Int32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.extend16_s";
    goto LAB_00a41537;
  case ExtendS8Int64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend8_s";
    goto LAB_00a41548;
  case ExtendS16Int64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend16_s";
    goto LAB_00a41537;
  case ExtendS32Int64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend32_s";
    goto LAB_00a41537;
  case TruncSatSFloat32ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_sat_f32_s";
    goto LAB_00a4156a;
  case TruncSatUFloat32ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_sat_f32_u";
    goto LAB_00a4156a;
  case TruncSatSFloat64ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_sat_f64_s";
    goto LAB_00a4156a;
  case TruncSatUFloat64ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_sat_f64_u";
    goto LAB_00a4156a;
  case TruncSatSFloat32ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_sat_f32_s";
    goto LAB_00a4156a;
  case TruncSatUFloat32ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_sat_f32_u";
    goto LAB_00a4156a;
  case TruncSatSFloat64ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_sat_f64_s";
    goto LAB_00a4156a;
  case TruncSatUFloat64ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_sat_f64_u";
LAB_00a4156a:
    lVar1 = 0x13;
    goto LAB_00a4159d;
  case SplatVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.splat";
    goto LAB_00a41559;
  case SplatVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.splat";
    goto LAB_00a41559;
  case SplatVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.splat";
    goto LAB_00a41559;
  case SplatVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.splat";
    goto LAB_00a41559;
  case SplatVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.splat";
    goto LAB_00a41559;
  case SplatVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.splat";
    goto LAB_00a41559;
  case NotVec128:
    poVar4 = *ppoVar2;
    pcVar3 = "v128.not";
LAB_00a4108e:
    lVar1 = 8;
    goto LAB_00a4159d;
  case AnyTrueVec128:
    poVar4 = *ppoVar2;
    pcVar3 = "v128.any_true";
    goto LAB_00a41548;
  case AbsVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.abs";
    break;
  case NegVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.neg";
    break;
  case AllTrueVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.all_true";
    goto LAB_00a41537;
  case BitmaskVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.bitmask";
    goto LAB_00a41548;
  case PopcntVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.popcnt";
LAB_00a410ec:
    lVar1 = 0xc;
    goto LAB_00a4159d;
  case AbsVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.abs";
    break;
  case NegVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.neg";
    break;
  case AllTrueVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.all_true";
    goto LAB_00a41537;
  case BitmaskVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.bitmask";
    goto LAB_00a41548;
  case AbsVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.abs";
    break;
  case NegVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.neg";
    break;
  case AllTrueVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.all_true";
    goto LAB_00a41537;
  case BitmaskVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.bitmask";
    goto LAB_00a41548;
  case AbsVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.abs";
    break;
  case NegVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.neg";
    break;
  case AllTrueVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.all_true";
LAB_00a41537:
    lVar1 = 0xe;
    goto LAB_00a4159d;
  case BitmaskVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.bitmask";
    goto LAB_00a41548;
  case AbsVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.abs";
    break;
  case NegVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.neg";
    break;
  case SqrtVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.sqrt";
    goto LAB_00a413dc;
  case CeilVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.ceil";
    goto LAB_00a413dc;
  case FloorVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.floor";
    goto LAB_00a41559;
  case TruncVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.trunc";
    goto LAB_00a41559;
  case NearestVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.nearest";
    goto LAB_00a41548;
  case AbsVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.abs";
    break;
  case NegVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.neg";
    break;
  case SqrtVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.sqrt";
    goto LAB_00a413dc;
  case CeilVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.ceil";
    goto LAB_00a413dc;
  case FloorVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.floor";
    goto LAB_00a41559;
  case TruncVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.trunc";
    goto LAB_00a41559;
  case NearestVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.nearest";
    goto LAB_00a41548;
  case AbsVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.abs";
    break;
  case NegVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.neg";
    break;
  case SqrtVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.sqrt";
    goto LAB_00a413dc;
  case CeilVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.ceil";
LAB_00a413dc:
    lVar1 = 10;
    goto LAB_00a4159d;
  case FloorVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.floor";
    goto LAB_00a41559;
  case TruncVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.trunc";
    goto LAB_00a41559;
  case NearestVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.nearest";
LAB_00a41548:
    lVar1 = 0xd;
    goto LAB_00a4159d;
  case ExtAddPairwiseSVecI8x16ToI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extadd_pairwise_i8x16_s";
    goto LAB_00a413aa;
  case ExtAddPairwiseUVecI8x16ToI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extadd_pairwise_i8x16_u";
    goto LAB_00a413aa;
  case ExtAddPairwiseSVecI16x8ToI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extadd_pairwise_i16x8_s";
    goto LAB_00a413aa;
  case ExtAddPairwiseUVecI16x8ToI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extadd_pairwise_i16x8_u";
LAB_00a413aa:
    lVar1 = 0x1d;
    goto LAB_00a4159d;
  case TruncSatSVecF32x4ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.trunc_sat_f32x4_s";
    goto LAB_00a41330;
  case TruncSatUVecF32x4ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.trunc_sat_f32x4_u";
    goto LAB_00a41330;
  case ConvertSVecI32x4ToVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.convert_i32x4_s";
    goto LAB_00a41308;
  case ConvertUVecI32x4ToVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.convert_i32x4_u";
    goto LAB_00a41308;
  case ExtendLowSVecI8x16ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extend_low_i8x16_s";
    goto LAB_00a410c9;
  case ExtendHighSVecI8x16ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extend_high_i8x16_s";
    goto LAB_00a413ff;
  case ExtendLowUVecI8x16ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extend_low_i8x16_u";
    goto LAB_00a410c9;
  case ExtendHighUVecI8x16ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extend_high_i8x16_u";
    goto LAB_00a413ff;
  case ExtendLowSVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extend_low_i16x8_s";
    goto LAB_00a410c9;
  case ExtendHighSVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extend_high_i16x8_s";
    goto LAB_00a413ff;
  case ExtendLowUVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extend_low_i16x8_u";
    goto LAB_00a410c9;
  case ExtendHighUVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extend_high_i16x8_u";
    goto LAB_00a413ff;
  case ExtendLowSVecI32x4ToVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extend_low_i32x4_s";
    goto LAB_00a410c9;
  case ExtendHighSVecI32x4ToVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extend_high_i32x4_s";
    goto LAB_00a413ff;
  case ExtendLowUVecI32x4ToVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extend_low_i32x4_u";
LAB_00a410c9:
    lVar1 = 0x18;
    goto LAB_00a4159d;
  case ExtendHighUVecI32x4ToVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extend_high_i32x4_u";
    goto LAB_00a413ff;
  case ConvertLowSVecI32x4ToVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.convert_low_i32x4_s";
    goto LAB_00a413ff;
  case ConvertLowUVecI32x4ToVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.convert_low_i32x4_u";
LAB_00a413ff:
    lVar1 = 0x19;
    goto LAB_00a4159d;
  case TruncSatZeroSVecF64x2ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.trunc_sat_f64x2_s_zero";
    goto LAB_00a4131c;
  case TruncSatZeroUVecF64x2ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.trunc_sat_f64x2_u_zero";
LAB_00a4131c:
    lVar1 = 0x1c;
    goto LAB_00a4159d;
  case DemoteZeroVecF64x2ToVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.demote_f64x2_zero";
    goto LAB_00a41330;
  case PromoteLowVecF32x4ToVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.promote_low_f32x4";
    goto LAB_00a41330;
  case RelaxedTruncSVecF32x4ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.relaxed_trunc_f32x4_s";
    goto LAB_00a412d6;
  case RelaxedTruncUVecF32x4ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.relaxed_trunc_f32x4_u";
LAB_00a412d6:
    lVar1 = 0x1b;
    goto LAB_00a4159d;
  case RelaxedTruncZeroSVecF64x2ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.relaxed_trunc_f64x2_s_zero";
    goto LAB_00a4121d;
  case RelaxedTruncZeroUVecF64x2ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.relaxed_trunc_f64x2_u_zero";
LAB_00a4121d:
    lVar1 = 0x20;
    goto LAB_00a4159d;
  case SplatVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.splat";
LAB_00a41559:
    lVar1 = 0xb;
    goto LAB_00a4159d;
  case TruncSatSVecF16x8ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.trunc_sat_f16x8_s";
    goto LAB_00a41330;
  case TruncSatUVecF16x8ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.trunc_sat_f16x8_u";
LAB_00a41330:
    lVar1 = 0x17;
    goto LAB_00a4159d;
  case ConvertSVecI16x8ToVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.convert_i16x8_s";
    goto LAB_00a41308;
  case ConvertUVecI16x8ToVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.convert_i16x8_u";
LAB_00a41308:
    lVar1 = 0x15;
    goto LAB_00a4159d;
  case InvalidUnary:
    handle_unreachable("unvalid unary operator",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x5a3);
  default:
    goto switchD_00a40d2c_default;
  }
  lVar1 = 9;
LAB_00a4159d:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar1);
switchD_00a40d2c_default:
  Colors::outputColorCode(*ppoVar2,"\x1b[0m");
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    prepareColor(o);
    switch (curr->op) {
      case ClzInt32:
        o << "i32.clz";
        break;
      case CtzInt32:
        o << "i32.ctz";
        break;
      case PopcntInt32:
        o << "i32.popcnt";
        break;
      case EqZInt32:
        o << "i32.eqz";
        break;
      case ClzInt64:
        o << "i64.clz";
        break;
      case CtzInt64:
        o << "i64.ctz";
        break;
      case PopcntInt64:
        o << "i64.popcnt";
        break;
      case EqZInt64:
        o << "i64.eqz";
        break;
      case NegFloat32:
        o << "f32.neg";
        break;
      case AbsFloat32:
        o << "f32.abs";
        break;
      case CeilFloat32:
        o << "f32.ceil";
        break;
      case FloorFloat32:
        o << "f32.floor";
        break;
      case TruncFloat32:
        o << "f32.trunc";
        break;
      case NearestFloat32:
        o << "f32.nearest";
        break;
      case SqrtFloat32:
        o << "f32.sqrt";
        break;
      case NegFloat64:
        o << "f64.neg";
        break;
      case AbsFloat64:
        o << "f64.abs";
        break;
      case CeilFloat64:
        o << "f64.ceil";
        break;
      case FloorFloat64:
        o << "f64.floor";
        break;
      case TruncFloat64:
        o << "f64.trunc";
        break;
      case NearestFloat64:
        o << "f64.nearest";
        break;
      case SqrtFloat64:
        o << "f64.sqrt";
        break;
      case ExtendSInt32:
        o << "i64.extend_i32_s";
        break;
      case ExtendUInt32:
        o << "i64.extend_i32_u";
        break;
      case WrapInt64:
        o << "i32.wrap_i64";
        break;
      case TruncSFloat32ToInt32:
        o << "i32.trunc_f32_s";
        break;
      case TruncSFloat32ToInt64:
        o << "i64.trunc_f32_s";
        break;
      case TruncUFloat32ToInt32:
        o << "i32.trunc_f32_u";
        break;
      case TruncUFloat32ToInt64:
        o << "i64.trunc_f32_u";
        break;
      case TruncSFloat64ToInt32:
        o << "i32.trunc_f64_s";
        break;
      case TruncSFloat64ToInt64:
        o << "i64.trunc_f64_s";
        break;
      case TruncUFloat64ToInt32:
        o << "i32.trunc_f64_u";
        break;
      case TruncUFloat64ToInt64:
        o << "i64.trunc_f64_u";
        break;
      case ReinterpretFloat32:
        o << "i32.reinterpret_f32";
        break;
      case ReinterpretFloat64:
        o << "i64.reinterpret_f64";
        break;
      case ConvertUInt32ToFloat32:
        o << "f32.convert_i32_u";
        break;
      case ConvertUInt32ToFloat64:
        o << "f64.convert_i32_u";
        break;
      case ConvertSInt32ToFloat32:
        o << "f32.convert_i32_s";
        break;
      case ConvertSInt32ToFloat64:
        o << "f64.convert_i32_s";
        break;
      case ConvertUInt64ToFloat32:
        o << "f32.convert_i64_u";
        break;
      case ConvertUInt64ToFloat64:
        o << "f64.convert_i64_u";
        break;
      case ConvertSInt64ToFloat32:
        o << "f32.convert_i64_s";
        break;
      case ConvertSInt64ToFloat64:
        o << "f64.convert_i64_s";
        break;
      case PromoteFloat32:
        o << "f64.promote_f32";
        break;
      case DemoteFloat64:
        o << "f32.demote_f64";
        break;
      case ReinterpretInt32:
        o << "f32.reinterpret_i32";
        break;
      case ReinterpretInt64:
        o << "f64.reinterpret_i64";
        break;
      case ExtendS8Int32:
        o << "i32.extend8_s";
        break;
      case ExtendS16Int32:
        o << "i32.extend16_s";
        break;
      case ExtendS8Int64:
        o << "i64.extend8_s";
        break;
      case ExtendS16Int64:
        o << "i64.extend16_s";
        break;
      case ExtendS32Int64:
        o << "i64.extend32_s";
        break;
      case TruncSatSFloat32ToInt32:
        o << "i32.trunc_sat_f32_s";
        break;
      case TruncSatUFloat32ToInt32:
        o << "i32.trunc_sat_f32_u";
        break;
      case TruncSatSFloat64ToInt32:
        o << "i32.trunc_sat_f64_s";
        break;
      case TruncSatUFloat64ToInt32:
        o << "i32.trunc_sat_f64_u";
        break;
      case TruncSatSFloat32ToInt64:
        o << "i64.trunc_sat_f32_s";
        break;
      case TruncSatUFloat32ToInt64:
        o << "i64.trunc_sat_f32_u";
        break;
      case TruncSatSFloat64ToInt64:
        o << "i64.trunc_sat_f64_s";
        break;
      case TruncSatUFloat64ToInt64:
        o << "i64.trunc_sat_f64_u";
        break;
      case SplatVecI8x16:
        o << "i8x16.splat";
        break;
      case SplatVecI16x8:
        o << "i16x8.splat";
        break;
      case SplatVecI32x4:
        o << "i32x4.splat";
        break;
      case SplatVecI64x2:
        o << "i64x2.splat";
        break;
      case SplatVecF16x8:
        o << "f16x8.splat";
        break;
      case SplatVecF32x4:
        o << "f32x4.splat";
        break;
      case SplatVecF64x2:
        o << "f64x2.splat";
        break;
      case NotVec128:
        o << "v128.not";
        break;
      case AnyTrueVec128:
        o << "v128.any_true";
        break;
      case AbsVecI8x16:
        o << "i8x16.abs";
        break;
      case NegVecI8x16:
        o << "i8x16.neg";
        break;
      case AllTrueVecI8x16:
        o << "i8x16.all_true";
        break;
      case BitmaskVecI8x16:
        o << "i8x16.bitmask";
        break;
      case PopcntVecI8x16:
        o << "i8x16.popcnt";
        break;
      case AbsVecI16x8:
        o << "i16x8.abs";
        break;
      case NegVecI16x8:
        o << "i16x8.neg";
        break;
      case AllTrueVecI16x8:
        o << "i16x8.all_true";
        break;
      case BitmaskVecI16x8:
        o << "i16x8.bitmask";
        break;
      case AbsVecI32x4:
        o << "i32x4.abs";
        break;
      case NegVecI32x4:
        o << "i32x4.neg";
        break;
      case AllTrueVecI32x4:
        o << "i32x4.all_true";
        break;
      case BitmaskVecI32x4:
        o << "i32x4.bitmask";
        break;
      case AbsVecI64x2:
        o << "i64x2.abs";
        break;
      case NegVecI64x2:
        o << "i64x2.neg";
        break;
      case AllTrueVecI64x2:
        o << "i64x2.all_true";
        break;
      case BitmaskVecI64x2:
        o << "i64x2.bitmask";
        break;
      case AbsVecF16x8:
        o << "f16x8.abs";
        break;
      case NegVecF16x8:
        o << "f16x8.neg";
        break;
      case SqrtVecF16x8:
        o << "f16x8.sqrt";
        break;
      case CeilVecF16x8:
        o << "f16x8.ceil";
        break;
      case FloorVecF16x8:
        o << "f16x8.floor";
        break;
      case TruncVecF16x8:
        o << "f16x8.trunc";
        break;
      case NearestVecF16x8:
        o << "f16x8.nearest";
        break;
      case AbsVecF32x4:
        o << "f32x4.abs";
        break;
      case NegVecF32x4:
        o << "f32x4.neg";
        break;
      case SqrtVecF32x4:
        o << "f32x4.sqrt";
        break;
      case CeilVecF32x4:
        o << "f32x4.ceil";
        break;
      case FloorVecF32x4:
        o << "f32x4.floor";
        break;
      case TruncVecF32x4:
        o << "f32x4.trunc";
        break;
      case NearestVecF32x4:
        o << "f32x4.nearest";
        break;
      case AbsVecF64x2:
        o << "f64x2.abs";
        break;
      case NegVecF64x2:
        o << "f64x2.neg";
        break;
      case SqrtVecF64x2:
        o << "f64x2.sqrt";
        break;
      case CeilVecF64x2:
        o << "f64x2.ceil";
        break;
      case FloorVecF64x2:
        o << "f64x2.floor";
        break;
      case TruncVecF64x2:
        o << "f64x2.trunc";
        break;
      case NearestVecF64x2:
        o << "f64x2.nearest";
        break;
      case ExtAddPairwiseSVecI8x16ToI16x8:
        o << "i16x8.extadd_pairwise_i8x16_s";
        break;
      case ExtAddPairwiseUVecI8x16ToI16x8:
        o << "i16x8.extadd_pairwise_i8x16_u";
        break;
      case ExtAddPairwiseSVecI16x8ToI32x4:
        o << "i32x4.extadd_pairwise_i16x8_s";
        break;
      case ExtAddPairwiseUVecI16x8ToI32x4:
        o << "i32x4.extadd_pairwise_i16x8_u";
        break;
      case TruncSatSVecF32x4ToVecI32x4:
        o << "i32x4.trunc_sat_f32x4_s";
        break;
      case TruncSatUVecF32x4ToVecI32x4:
        o << "i32x4.trunc_sat_f32x4_u";
        break;
      case ConvertSVecI32x4ToVecF32x4:
        o << "f32x4.convert_i32x4_s";
        break;
      case ConvertUVecI32x4ToVecF32x4:
        o << "f32x4.convert_i32x4_u";
        break;
      case ExtendLowSVecI8x16ToVecI16x8:
        o << "i16x8.extend_low_i8x16_s";
        break;
      case ExtendHighSVecI8x16ToVecI16x8:
        o << "i16x8.extend_high_i8x16_s";
        break;
      case ExtendLowUVecI8x16ToVecI16x8:
        o << "i16x8.extend_low_i8x16_u";
        break;
      case ExtendHighUVecI8x16ToVecI16x8:
        o << "i16x8.extend_high_i8x16_u";
        break;
      case ExtendLowSVecI16x8ToVecI32x4:
        o << "i32x4.extend_low_i16x8_s";
        break;
      case ExtendHighSVecI16x8ToVecI32x4:
        o << "i32x4.extend_high_i16x8_s";
        break;
      case ExtendLowUVecI16x8ToVecI32x4:
        o << "i32x4.extend_low_i16x8_u";
        break;
      case ExtendHighUVecI16x8ToVecI32x4:
        o << "i32x4.extend_high_i16x8_u";
        break;
      case ExtendLowSVecI32x4ToVecI64x2:
        o << "i64x2.extend_low_i32x4_s";
        break;
      case ExtendHighSVecI32x4ToVecI64x2:
        o << "i64x2.extend_high_i32x4_s";
        break;
      case ExtendLowUVecI32x4ToVecI64x2:
        o << "i64x2.extend_low_i32x4_u";
        break;
      case ExtendHighUVecI32x4ToVecI64x2:
        o << "i64x2.extend_high_i32x4_u";
        break;
      case ConvertLowSVecI32x4ToVecF64x2:
        o << "f64x2.convert_low_i32x4_s";
        break;
      case ConvertLowUVecI32x4ToVecF64x2:
        o << "f64x2.convert_low_i32x4_u";
        break;
      case TruncSatZeroSVecF64x2ToVecI32x4:
        o << "i32x4.trunc_sat_f64x2_s_zero";
        break;
      case TruncSatZeroUVecF64x2ToVecI32x4:
        o << "i32x4.trunc_sat_f64x2_u_zero";
        break;
      case DemoteZeroVecF64x2ToVecF32x4:
        o << "f32x4.demote_f64x2_zero";
        break;
      case PromoteLowVecF32x4ToVecF64x2:
        o << "f64x2.promote_low_f32x4";
        break;
      case RelaxedTruncSVecF32x4ToVecI32x4:
        o << "i32x4.relaxed_trunc_f32x4_s";
        break;
      case RelaxedTruncUVecF32x4ToVecI32x4:
        o << "i32x4.relaxed_trunc_f32x4_u";
        break;
      case RelaxedTruncZeroSVecF64x2ToVecI32x4:
        o << "i32x4.relaxed_trunc_f64x2_s_zero";
        break;
      case RelaxedTruncZeroUVecF64x2ToVecI32x4:
        o << "i32x4.relaxed_trunc_f64x2_u_zero";
        break;
      case TruncSatSVecF16x8ToVecI16x8:
        o << "i16x8.trunc_sat_f16x8_s";
        break;
      case TruncSatUVecF16x8ToVecI16x8:
        o << "i16x8.trunc_sat_f16x8_u";
        break;
      case ConvertSVecI16x8ToVecF16x8:
        o << "f16x8.convert_i16x8_s";
        break;
      case ConvertUVecI16x8ToVecF16x8:
        o << "f16x8.convert_i16x8_u";
        break;
      case InvalidUnary:
        WASM_UNREACHABLE("unvalid unary operator");
    }
    restoreNormalColor(o);
  }